

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-encoder.c
# Opt level: O0

int mg_session_send_init_message(mg_session *session,char *client_name,mg_map *auth_token)

{
  uint32_t len;
  uint32_t uVar1;
  mg_session *session_00;
  char *in_RSI;
  int status_3;
  int status_2;
  int status_1;
  int status;
  size_t client_name_len;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint32_t local_4;
  
  session_00 = (mg_session *)strlen(in_RSI);
  if (session_00 < (mg_session *)0x100000000) {
    len = mg_session_write_uint8
                    ((mg_session *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (uint8_t)((uint)in_stack_ffffffffffffffcc >> 0x18));
    local_4 = len;
    if ((((len == 0) &&
         (uVar1 = mg_session_write_uint8
                            ((mg_session *)(ulong)in_stack_ffffffffffffffd0,
                             (uint8_t)((uint)in_stack_ffffffffffffffcc >> 0x18)), local_4 = uVar1,
         uVar1 == 0)) &&
        (local_4 = mg_session_write_string2
                             (session_00,len,
                              (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8))
        , local_4 == 0)) &&
       (local_4 = mg_session_write_map(session_00,(mg_map *)CONCAT44(len,uVar1)), local_4 == 0)) {
      local_4 = mg_session_flush_message(session_00);
    }
  }
  else {
    local_4 = 0xfffffff0;
  }
  return local_4;
}

Assistant:

int mg_session_send_init_message(mg_session *session, const char *client_name,
                                 const mg_map *auth_token) {
  size_t client_name_len = strlen(client_name);
  if (client_name_len > UINT32_MAX) {
    return MG_ERROR_SIZE_EXCEEDED;
  }
  MG_RETURN_IF_FAILED(
      mg_session_write_uint8(session, (uint8_t)(MG_MARKER_TINY_STRUCT + 2)));
  MG_RETURN_IF_FAILED(
      mg_session_write_uint8(session, MG_SIGNATURE_MESSAGE_HELLO));
  MG_RETURN_IF_FAILED(mg_session_write_string2(
      session, (uint32_t)client_name_len, client_name));
  MG_RETURN_IF_FAILED(mg_session_write_map(session, auth_token));
  return mg_session_flush_message(session);
}